

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeH1.cpp
# Opt level: O2

void TPZShapeH1<pzshape::TPZShapeLinear>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZShapeData *data)

{
  int iVar1;
  long lVar2;
  long newRows;
  TPZManVector<int,_27> local_b0;
  
  if ((ids->fNElements == 2) && (connectorders->fNElements == 1)) {
    TPZManVector<int,_27>::TPZManVector(&local_b0,connectorders);
    TPZManVector<int,_27>::operator=(&data->fH1ConnectOrders,&local_b0);
    TPZManVector<int,_27>::~TPZManVector(&local_b0);
    ComputeTransforms<pzshape::TPZShapeLinear>
              (ids,&(data->fSideTransforms).super_TPZVec<TPZTransform<double>_>);
    TPZManVector<long,_8>::TPZManVector((TPZManVector<long,_8> *)&local_b0,ids);
    TPZManVector<long,_8>::operator=(&data->fCornerNodeIds,(TPZManVector<long,_8> *)&local_b0);
    TPZManVector<long,_8>::~TPZManVector((TPZManVector<long,_8> *)&local_b0);
    (*(data->fH1NumConnectShape).super_TPZVec<int>._vptr_TPZVec[3])(&data->fH1NumConnectShape,1);
    newRows = 2;
    for (lVar2 = 0; lVar2 != 1; lVar2 = lVar2 + 1) {
      iVar1 = pzshape::TPZShapeLinear::NConnectShapeF((int)lVar2 + 2,connectorders->fStore[lVar2]);
      (data->fH1NumConnectShape).super_TPZVec<int>.fStore[lVar2] = iVar1;
      newRows = newRows + iVar1;
    }
    TPZFMatrix<double>::Resize(&(data->fPhi).super_TPZFMatrix<double>,newRows,1);
    TPZFMatrix<double>::Resize(&(data->fDPhi).super_TPZFMatrix<double>,1,newRows);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeH1.cpp"
             ,0x15);
}

Assistant:

void TPZShapeH1<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                           const TPZVec<int> &connectorders,
                                           TPZShapeData &data) {
    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
    if((ids.size() != ncorner || connectorders.size() != nsides-ncorner) && TSHAPE::Type() != EPoint)
    {
        DebugStop();
    }
    data.fH1ConnectOrders = connectorders;
    ComputeTransforms<TSHAPE>(ids, data.fSideTransforms);
    data.fCornerNodeIds = ids;
    data.fH1NumConnectShape.resize(TSHAPE::NSides-TSHAPE::NCornerNodes);
    int64_t nshape = TSHAPE::NCornerNodes;
    for(int i = TSHAPE::NCornerNodes; i < TSHAPE::NSides; i++)
    {
        int nshapeconnect = TSHAPE::NConnectShapeF(i,connectorders[i-TSHAPE::NCornerNodes]);
        data.fH1NumConnectShape[i-TSHAPE::NCornerNodes] = nshapeconnect;
        nshape += nshapeconnect;
    }
    data.fPhi.Resize(nshape,1);
    data.fDPhi.Resize(TSHAPE::Dimension, nshape);
//    fNodeIds = ids; Should we make it an attribute of the class?
}